

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__create_png_image
              (stbi__png *a,stbi_uc *image_data,stbi__uint32 image_data_len,int out_n,int depth,
              int color,int interlaced)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  void *__ptr;
  int in_ECX;
  long *in_RDI;
  int in_R8D;
  undefined4 in_R9D;
  int in_stack_00000008;
  int out_x;
  int out_y;
  stbi__uint32 img_len;
  int y;
  int x;
  int j;
  int i;
  int yspc [7];
  int xspc [7];
  int yorig [7];
  int xorig [7];
  int p;
  stbi_uc *final;
  int out_bytes;
  int bytes;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  int local_c0;
  int local_bc;
  uint local_b8 [8];
  uint local_98 [8];
  int local_78 [8];
  int local_58 [6];
  stbi__uint32 in_stack_ffffffffffffffc0;
  stbi__uint32 in_stack_ffffffffffffffc4;
  stbi__uint32 x_00;
  undefined8 in_stack_ffffffffffffffc8;
  int in_stack_fffffffffffffff8;
  int local_4;
  
  iVar1 = 1;
  if (in_R8D == 0x10) {
    iVar1 = 2;
  }
  iVar2 = in_ECX * iVar1;
  if (in_stack_00000008 == 0) {
    local_4 = stbi__create_png_image_raw
                        ((stbi__png *)CONCAT44(in_R8D,in_R9D),(stbi_uc *)CONCAT44(iVar1,iVar2),
                         (stbi__uint32)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                         (int)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                         in_stack_ffffffffffffffc0,(int)in_RDI,in_stack_fffffffffffffff8);
  }
  else {
    __ptr = stbi__malloc_mad3(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,0,0x121b26);
    if (__ptr == (void *)0x0) {
      local_4 = stbi__err("outofmem");
    }
    else {
      for (x_00 = 0; (int)x_00 < 7; x_00 = x_00 + 1) {
        local_58[0] = 0;
        local_58[1] = 4;
        local_58[2] = 0;
        local_58[3] = 2;
        local_58[4] = 0;
        local_58[5] = 1;
        local_78[0] = 0;
        local_78[1] = 0;
        local_78[2] = 4;
        local_78[3] = 0;
        local_78[4] = 2;
        local_78[5] = 0;
        local_78[6] = 1;
        local_98[0] = 8;
        local_98[1] = 8;
        local_98[2] = 4;
        local_98[3] = 4;
        local_98[4] = 2;
        local_98[5] = 2;
        local_98[6] = 1;
        local_b8[0] = 8;
        local_b8[1] = 8;
        local_b8[2] = 8;
        local_b8[3] = 4;
        local_b8[4] = 4;
        local_b8[5] = 2;
        local_b8[6] = 2;
        uVar3 = (((*(int *)*in_RDI - local_58[(int)x_00]) + local_98[(int)x_00]) - 1) /
                local_98[(int)x_00];
        uVar4 = (((*(int *)(*in_RDI + 4) - local_78[(int)x_00]) + local_b8[(int)x_00]) - 1) /
                local_b8[(int)x_00];
        if ((uVar3 != 0) && (uVar4 != 0)) {
          iVar5 = stbi__create_png_image_raw
                            ((stbi__png *)CONCAT44(in_R8D,in_R9D),(stbi_uc *)CONCAT44(iVar1,iVar2),
                             (stbi__uint32)((ulong)__ptr >> 0x20),(int)__ptr,x_00,0,(int)in_RDI,
                             in_stack_fffffffffffffff8);
          if (iVar5 == 0) {
            free(__ptr);
            return 0;
          }
          for (local_c0 = 0; local_c0 < (int)uVar4; local_c0 = local_c0 + 1) {
            for (local_bc = 0; local_bc < (int)uVar3; local_bc = local_bc + 1) {
              memcpy((void *)((long)__ptr +
                             (long)(int)((local_bc * local_98[(int)x_00] + local_58[(int)x_00]) *
                                        iVar2) +
                             (ulong)((local_c0 * local_b8[(int)x_00] + local_78[(int)x_00]) *
                                     *(int *)*in_RDI * iVar2)),
                     (void *)(in_RDI[3] + (long)(int)((local_c0 * uVar3 + local_bc) * iVar2)),
                     (long)iVar2);
            }
          }
          free((void *)in_RDI[3]);
        }
      }
      in_RDI[3] = (long)__ptr;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int stbi__create_png_image(stbi__png *a, stbi_uc *image_data, stbi__uint32 image_data_len, int out_n, int depth, int color, int interlaced)
{
   int bytes = (depth == 16 ? 2 : 1);
   int out_bytes = out_n * bytes;
   stbi_uc *final;
   int p;
   if (!interlaced)
      return stbi__create_png_image_raw(a, image_data, image_data_len, out_n, a->s->img_x, a->s->img_y, depth, color);

   // de-interlacing
   final = (stbi_uc *) stbi__malloc_mad3(a->s->img_x, a->s->img_y, out_bytes, 0);
   if (!final) return stbi__err("outofmem", "Out of memory");
   for (p=0; p < 7; ++p) {
      int xorig[] = { 0,4,0,2,0,1,0 };
      int yorig[] = { 0,0,4,0,2,0,1 };
      int xspc[]  = { 8,8,4,4,2,2,1 };
      int yspc[]  = { 8,8,8,4,4,2,2 };
      int i,j,x,y;
      // pass1_x[4] = 0, pass1_x[5] = 1, pass1_x[12] = 1
      x = (a->s->img_x - xorig[p] + xspc[p]-1) / xspc[p];
      y = (a->s->img_y - yorig[p] + yspc[p]-1) / yspc[p];
      if (x && y) {
         stbi__uint32 img_len = ((((a->s->img_n * x * depth) + 7) >> 3) + 1) * y;
         if (!stbi__create_png_image_raw(a, image_data, image_data_len, out_n, x, y, depth, color)) {
            STBI_FREE(final);
            return 0;
         }
         for (j=0; j < y; ++j) {
            for (i=0; i < x; ++i) {
               int out_y = j*yspc[p]+yorig[p];
               int out_x = i*xspc[p]+xorig[p];
               memcpy(final + out_y*a->s->img_x*out_bytes + out_x*out_bytes,
                      a->out + (j*x+i)*out_bytes, out_bytes);
            }
         }
         STBI_FREE(a->out);
         image_data += img_len;
         image_data_len -= img_len;
      }
   }
   a->out = final;

   return 1;
}